

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestTestList.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_2e961::TestListAdderAddsTestToList::RunImpl(TestListAdderAddsTestToList *this)

{
  TestResults *pTVar1;
  Test *pTVar2;
  TestResults **ppTVar3;
  TestDetails **ppTVar4;
  ListAdder adder;
  TestDetails local_78;
  TestList list;
  Test test;
  
  UnitTest::TestList::TestList(&list);
  UnitTest::Test::Test(&test,"","DefaultSuite","",0);
  UnitTest::ListAdder::ListAdder(&adder,&list,&test);
  pTVar2 = UnitTest::TestList::GetHead(&list);
  if (pTVar2 != &test) {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_78,*ppTVar4,0x2e);
    UnitTest::TestResults::OnTestFailure(pTVar1,&local_78,"list.GetHead() == &test");
  }
  if (test.next != (Test *)0x0) {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_78,*ppTVar4,0x2f);
    UnitTest::TestResults::OnTestFailure(pTVar1,&local_78,"test.next == 0");
  }
  UnitTest::Test::~Test(&test);
  return;
}

Assistant:

TEST (ListAdderAddsTestToList)
{
    TestList list;

    Test test("");    
    ListAdder adder(list, &test);

    CHECK (list.GetHead() == &test);
    CHECK (test.next == 0);
}